

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

filename_t *
spdlog::sinks::daily_filename_calculator::calc_filename(filename_t *filename,tm *now_tm)

{
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char> bVar1;
  undefined1 in_stack_00000040 [16];
  string_view in_stack_00000050;
  filename_t ext;
  filename_t basename;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  basic_string_view<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe1c;
  int *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string local_170 [24];
  filename_t *in_stack_fffffffffffffea8;
  string local_150 [32];
  long local_130;
  undefined1 local_118 [88];
  undefined8 local_c0;
  undefined1 *local_b8;
  string *local_a0;
  long local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  string *local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  basic_string_view<char> *local_58;
  undefined1 *local_50;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined1 *local_8;
  
  local_130 = in_RDX;
  std::__cxx11::string::string(local_150);
  std::__cxx11::string::string(local_170);
  details::file_helper::split_by_extension(in_stack_fffffffffffffea8);
  std::tie<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x1eae57);
  calc_filename::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&stack0xfffffffffffffe1e);
  pbVar2 = (basic_string_view<char> *)&stack0xfffffffffffffe20;
  local_60 = &stack0xfffffffffffffe1f;
  local_58 = pbVar2;
  bVar1 = ::fmt::v8::operator()((FMT_COMPILE_STRING *)0x1eae96);
  *pbVar2 = bVar1;
  ::fmt::v8::detail::
  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_const_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_98 = local_130 + 0xc;
  local_80 = local_150;
  local_88 = &stack0xfffffffffffffe18;
  local_90 = &stack0xfffffffffffffe14;
  local_a0 = local_170;
  local_50 = local_78;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&,int&,int&,int_const&,std::__cxx11::string&>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (int *)CONCAT44(in_stack_fffffffffffffe1c,*(int *)(local_130 + 0x14) + 0x76c),
             (int *)CONCAT44(*(int *)(local_130 + 0x10) + 1,in_stack_fffffffffffffe10),in_RDI);
  local_28 = &local_c0;
  local_30 = local_118;
  local_18 = 0xd111d;
  local_c0 = 0xd111d;
  local_20 = local_30;
  local_10 = local_28;
  local_8 = local_30;
  local_b8 = local_30;
  ::fmt::v8::vformat_abi_cxx11_(in_stack_00000050,(format_args)in_stack_00000040);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_150);
  return in_RDI;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
        return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}")), basename, now_tm.tm_year + 1900,
            now_tm.tm_mon + 1, now_tm.tm_mday, ext);
    }